

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

int Abc_ObjLevelNew(Abc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  uVar1 = (pObj->vFanins).nSize;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  iVar2 = 0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    fVar6 = (float)(*(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[uVar3]] + 0x14)
                   >> 0xc);
    fVar5 = (float)iVar2;
    if ((float)iVar2 <= fVar6) {
      fVar5 = fVar6;
    }
    iVar2 = (int)fVar5;
  }
  return iVar2 + (uint)(0 < (int)uVar1);
}

Assistant:

int Abc_ObjLevelNew( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Level = 0;
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Level = Abc_MaxFloat( Level, Abc_ObjLevel(pFanin) );
    return Level + (int)(Abc_ObjFaninNum(pObj) > 0);
}